

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O1

void add_to_hit(artifact *art,wchar_t fixed,wchar_t random)

{
  uint32_t uVar1;
  wchar_t wVar2;
  char *fmt;
  
  if (art->to_h < L'\x1b') {
    if (L'\x10' < art->to_h) {
      uVar1 = 2;
      goto LAB_0019a5d5;
    }
  }
  else {
    uVar1 = 6;
LAB_0019a5d5:
    uVar1 = Rand_div(uVar1);
    if (uVar1 != 0) {
      wVar2 = art->to_h;
      fmt = "Failed to add to-hit, value %d is too high\n";
      goto LAB_0019a611;
    }
  }
  uVar1 = Rand_div(fixed);
  wVar2 = (int)(short)((short)uVar1 + 1) + art->to_h;
  art->to_h = wVar2;
  fmt = "Adding ability: extra to_h (now %+d)\n";
LAB_0019a611:
  file_putf(log_file,fmt,(ulong)(uint)wVar2);
  return;
}

Assistant:

static void add_to_hit(struct artifact *art, int fixed, int random)
{
	/* Inhibit above certain threshholds */
	if (art->to_h > VERYHIGH_TO_HIT) {
		if (!INHIBIT_STRONG) {
			file_putf(log_file, "Failed to add to-hit, value %d is too high\n",
					  art->to_h);
			return;
		}
	} else if (art->to_h > HIGH_TO_HIT) {
		if (!INHIBIT_WEAK) {
			file_putf(log_file, "Failed to add to-hit, value %d is too high\n",
					  art->to_h);
			return;
		}
	}
	art->to_h += (int16_t)(fixed + randint0(random));
	file_putf(log_file, "Adding ability: extra to_h (now %+d)\n", art->to_h);
}